

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io-unix.c++
# Opt level: O3

void __thiscall
kj::anon_unknown_0::AsyncStreamFd::AsyncStreamFd
          (AsyncStreamFd *this,UnixEventPort *eventPort,int fd,uint flags,uint observerFlags)

{
  OwnedFileDescriptor::OwnedFileDescriptor(&this->super_OwnedFileDescriptor,fd,flags);
  (this->super_AsyncCapabilityStream).super_AsyncIoStream.super_AsyncInputStream.
  _vptr_AsyncInputStream = (_func_int **)&PTR_read_006e1e48;
  (this->super_AsyncCapabilityStream).super_AsyncIoStream.super_AsyncOutputStream.
  _vptr_AsyncOutputStream = (_func_int **)&PTR_write_006e1f18;
  this->eventPort = eventPort;
  UnixEventPort::FdObserver::FdObserver(&this->observer,eventPort,fd,observerFlags);
  (this->writeDisconnectedPromise).ptr.isSet = false;
  (this->ancillaryMsgCallback).ptr.isSet = false;
  return;
}

Assistant:

AsyncStreamFd(UnixEventPort& eventPort, int fd, uint flags, uint observerFlags)
      : OwnedFileDescriptor(fd, flags),
        eventPort(eventPort),
        observer(eventPort, fd, observerFlags) {}